

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme_Constant.h
# Opt level: O2

void __thiscall psy::C::IntegerConstant::~IntegerConstant(IntegerConstant *this)

{
  Lexeme::~Lexeme(&this->super_Lexeme);
  operator_delete(this,0x30);
  return;
}

Assistant:

class PSY_C_API IntegerConstant final : public Lexeme
{
public:
    //!@{
    /**
     * Cast \c this Lexeme as an IntegerConstant.
     */
    virtual IntegerConstant* asIntegerConstant() override { return this; }
    virtual const IntegerConstant* asIntegerConstant() const override { return this; }
    //!@}

    /**
     * The RepresentationSuffix alternatives of an IntegerConstant.
     *
     * \remark 6.4.4.1-5
     */
    enum class RepresentationSuffix : std::uint8_t
    {
        None,
        uOrU,
        lOrL,
        lOrLAnduOrU,
        llOrLL,
        llOrLLAnduOrU
    };

    /**
     * The RepresentationSuffix of \c this IntegerConstant.
     */
    RepresentationSuffix representationSuffix() const;

    /**
     * Whether \c this IntegerConstant is \a octal or \a hexadecimal.
     */
    bool isOctalOrHexadecimal() const;

    // TODO: Make internal.
    IntegerConstant(const char* chars, unsigned int size);
}